

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

int find_nearby_colors(j_decompress_ptr cinfo,int minc0,int minc1,int minc2,JSAMPLE *colorlist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lStack_878;
  INT32 mindist [256];
  INT32 tdist;
  INT32 max_dist;
  INT32 min_dist;
  INT32 minmaxdist;
  int ncolors;
  int x;
  int i;
  int centerc2;
  int centerc1;
  int centerc0;
  int maxc2;
  int maxc1;
  int maxc0;
  int numcolors;
  JSAMPLE *colorlist_local;
  int minc2_local;
  int minc1_local;
  int minc0_local;
  j_decompress_ptr cinfo_local;
  
  iVar1 = cinfo->actual_number_of_colors;
  iVar2 = minc0 + 0x18;
  iVar3 = minc1 + 0x1c;
  iVar4 = minc2 + 0x18;
  min_dist = 0x7fffffff;
  for (ncolors = 0; ncolors < iVar1; ncolors = ncolors + 1) {
    uVar5 = (uint)(*cinfo->colormap)[ncolors];
    if ((int)uVar5 < minc0) {
      lVar6 = (long)(int)((uVar5 - minc0) * 2);
      max_dist = lVar6 * lVar6;
      lVar6 = (long)(int)((uVar5 - iVar2) * 2);
      tdist = lVar6 * lVar6;
    }
    else if (iVar2 < (int)uVar5) {
      lVar6 = (long)(int)((uVar5 - iVar2) * 2);
      max_dist = lVar6 * lVar6;
      lVar6 = (long)(int)((uVar5 - minc0) * 2);
      tdist = lVar6 * lVar6;
    }
    else {
      max_dist = 0;
      if (minc0 + iVar2 >> 1 < (int)uVar5) {
        lVar6 = (long)(int)((uVar5 - minc0) * 2);
        tdist = lVar6 * lVar6;
      }
      else {
        lVar6 = (long)(int)((uVar5 - iVar2) * 2);
        tdist = lVar6 * lVar6;
      }
    }
    uVar5 = (uint)cinfo->colormap[1][ncolors];
    if ((int)uVar5 < minc1) {
      lVar6 = (long)(int)((uVar5 - minc1) * 3);
      max_dist = lVar6 * lVar6 + max_dist;
      lVar6 = (long)(int)((uVar5 - iVar3) * 3);
      lVar6 = lVar6 * lVar6;
    }
    else if (iVar3 < (int)uVar5) {
      lVar6 = (long)(int)((uVar5 - iVar3) * 3);
      max_dist = lVar6 * lVar6 + max_dist;
      lVar6 = (long)(int)((uVar5 - minc1) * 3);
      lVar6 = lVar6 * lVar6;
    }
    else if (minc1 + iVar3 >> 1 < (int)uVar5) {
      lVar6 = (long)(int)((uVar5 - minc1) * 3);
      lVar6 = lVar6 * lVar6;
    }
    else {
      lVar6 = (long)(int)((uVar5 - iVar3) * 3);
      lVar6 = lVar6 * lVar6;
    }
    tdist = lVar6 + tdist;
    uVar5 = (uint)cinfo->colormap[2][ncolors];
    if ((int)uVar5 < minc2) {
      max_dist = (long)(int)(uVar5 - minc2) * (long)(int)(uVar5 - minc2) + max_dist;
      lVar6 = (long)(int)(uVar5 - iVar4) * (long)(int)(uVar5 - iVar4);
    }
    else if (iVar4 < (int)uVar5) {
      max_dist = (long)(int)(uVar5 - iVar4) * (long)(int)(uVar5 - iVar4) + max_dist;
      lVar6 = (long)(int)(uVar5 - minc2) * (long)(int)(uVar5 - minc2);
    }
    else if (minc2 + iVar4 >> 1 < (int)uVar5) {
      lVar6 = (long)(int)(uVar5 - minc2) * (long)(int)(uVar5 - minc2);
    }
    else {
      lVar6 = (long)(int)(uVar5 - iVar4) * (long)(int)(uVar5 - iVar4);
    }
    tdist = lVar6 + tdist;
    mindist[(long)ncolors + -1] = max_dist;
    if (tdist < min_dist) {
      min_dist = tdist;
    }
  }
  minmaxdist._0_4_ = 0;
  for (ncolors = 0; ncolors < iVar1; ncolors = ncolors + 1) {
    if (mindist[(long)ncolors + -1] <= min_dist) {
      colorlist[(int)minmaxdist] = (JSAMPLE)ncolors;
      minmaxdist._0_4_ = (int)minmaxdist + 1;
    }
  }
  return (int)minmaxdist;
}

Assistant:

LOCAL(int)
find_nearby_colors (j_decompress_ptr cinfo, int minc0, int minc1, int minc2,
		    JSAMPLE colorlist[])
/* Locate the colormap entries close enough to an update box to be candidates
 * for the nearest entry to some cell(s) in the update box.  The update box
 * is specified by the center coordinates of its first cell.  The number of
 * candidate colormap entries is returned, and their colormap indexes are
 * placed in colorlist[].
 * This routine uses Heckbert's "locally sorted search" criterion to select
 * the colors that need further consideration.
 */
{
  int numcolors = cinfo->actual_number_of_colors;
  int maxc0, maxc1, maxc2;
  int centerc0, centerc1, centerc2;
  int i, x, ncolors;
  INT32 minmaxdist, min_dist, max_dist, tdist;
  INT32 mindist[MAXNUMCOLORS];	/* min distance to colormap entry i */

  /* Compute true coordinates of update box's upper corner and center.
   * Actually we compute the coordinates of the center of the upper-corner
   * histogram cell, which are the upper bounds of the volume we care about.
   * Note that since ">>" rounds down, the "center" values may be closer to
   * min than to max; hence comparisons to them must be "<=", not "<".
   */
  maxc0 = minc0 + ((1 << BOX_C0_SHIFT) - (1 << C0_SHIFT));
  centerc0 = (minc0 + maxc0) >> 1;
  maxc1 = minc1 + ((1 << BOX_C1_SHIFT) - (1 << C1_SHIFT));
  centerc1 = (minc1 + maxc1) >> 1;
  maxc2 = minc2 + ((1 << BOX_C2_SHIFT) - (1 << C2_SHIFT));
  centerc2 = (minc2 + maxc2) >> 1;

  /* For each color in colormap, find:
   *  1. its minimum squared-distance to any point in the update box
   *     (zero if color is within update box);
   *  2. its maximum squared-distance to any point in the update box.
   * Both of these can be found by considering only the corners of the box.
   * We save the minimum distance for each color in mindist[];
   * only the smallest maximum distance is of interest.
   */
  minmaxdist = 0x7FFFFFFFL;

  for (i = 0; i < numcolors; i++) {
    /* We compute the squared-c0-distance term, then add in the other two. */
    x = GETJSAMPLE(cinfo->colormap[0][i]);
    if (x < minc0) {
      tdist = (x - minc0) * C0_SCALE;
      min_dist = tdist*tdist;
      tdist = (x - maxc0) * C0_SCALE;
      max_dist = tdist*tdist;
    } else if (x > maxc0) {
      tdist = (x - maxc0) * C0_SCALE;
      min_dist = tdist*tdist;
      tdist = (x - minc0) * C0_SCALE;
      max_dist = tdist*tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      min_dist = 0;
      if (x <= centerc0) {
	tdist = (x - maxc0) * C0_SCALE;
	max_dist = tdist*tdist;
      } else {
	tdist = (x - minc0) * C0_SCALE;
	max_dist = tdist*tdist;
      }
    }

    x = GETJSAMPLE(cinfo->colormap[1][i]);
    if (x < minc1) {
      tdist = (x - minc1) * C1_SCALE;
      min_dist += tdist*tdist;
      tdist = (x - maxc1) * C1_SCALE;
      max_dist += tdist*tdist;
    } else if (x > maxc1) {
      tdist = (x - maxc1) * C1_SCALE;
      min_dist += tdist*tdist;
      tdist = (x - minc1) * C1_SCALE;
      max_dist += tdist*tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      if (x <= centerc1) {
	tdist = (x - maxc1) * C1_SCALE;
	max_dist += tdist*tdist;
      } else {
	tdist = (x - minc1) * C1_SCALE;
	max_dist += tdist*tdist;
      }
    }

    x = GETJSAMPLE(cinfo->colormap[2][i]);
    if (x < minc2) {
      tdist = (x - minc2) * C2_SCALE;
      min_dist += tdist*tdist;
      tdist = (x - maxc2) * C2_SCALE;
      max_dist += tdist*tdist;
    } else if (x > maxc2) {
      tdist = (x - maxc2) * C2_SCALE;
      min_dist += tdist*tdist;
      tdist = (x - minc2) * C2_SCALE;
      max_dist += tdist*tdist;
    } else {
      /* within cell range so no contribution to min_dist */
      if (x <= centerc2) {
	tdist = (x - maxc2) * C2_SCALE;
	max_dist += tdist*tdist;
      } else {
	tdist = (x - minc2) * C2_SCALE;
	max_dist += tdist*tdist;
      }
    }

    mindist[i] = min_dist;	/* save away the results */
    if (max_dist < minmaxdist)
      minmaxdist = max_dist;
  }

  /* Now we know that no cell in the update box is more than minmaxdist
   * away from some colormap entry.  Therefore, only colors that are
   * within minmaxdist of some part of the box need be considered.
   */
  ncolors = 0;
  for (i = 0; i < numcolors; i++) {
    if (mindist[i] <= minmaxdist)
      colorlist[ncolors++] = (JSAMPLE) i;
  }
  return ncolors;
}